

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O0

void __thiscall
boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b)

{
  bool bVar1;
  type_conflict *ptVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffc8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffe0;
  
  move<std::vector<unsigned_long,std::allocator<unsigned_long>>&>(in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_RDI,in_stack_ffffffffffffffc8);
  ptVar2 = move<unsigned_long&>((unsigned_long *)(in_RSI + 1));
  in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)*ptVar2;
  memset(&stack0xffffffffffffffd8,0,0x18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x188c07);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    (in_stack_ffffffffffffffe0);
  if (!bVar1) {
    __assert_fail("(b.m_bits = buffer_type()).empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                  ,0x295,
                  "boost::dynamic_bitset<>::dynamic_bitset(dynamic_bitset<Block, Allocator> &&) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                 );
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffffe0);
  in_RSI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  return;
}

Assistant:

inline dynamic_bitset<Block, Allocator>::
dynamic_bitset(dynamic_bitset<Block, Allocator>&& b)
  : m_bits(boost::move(b.m_bits)), m_num_bits(boost::move(b.m_num_bits))
{
    // Required so that assert(m_check_invariants()); works.
    assert((b.m_bits = buffer_type()).empty());
    b.m_num_bits = 0;
}